

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate.c
# Opt level: O0

void * dsAlloc(uint64_t length)

{
  dsCrate *crate_00;
  void *pvVar1;
  void *memory;
  dsCrate *crate;
  uint64_t length_local;
  
  crate_00 = getActiveCrate();
  if (crate_00 == (dsCrate *)0x0) {
    dsRunLogCallback("%s(): Can\'t get active crate.\n","dsAlloc");
    length_local = 0;
  }
  else {
    pvVar1 = allocateObject(crate_00,length);
    if (pvVar1 == (void *)0x0) {
      dsRunLogCallback("%s(): Can\'t allocate object.\n","dsAlloc");
      length_local = 0;
    }
    else {
      length_local = (long)pvVar1 + 0x10;
    }
  }
  return (void *)length_local;
}

Assistant:

void *
dsAlloc(uint64_t length)
{
	dsCrate *crate;
	void *memory;

	if ((crate = getActiveCrate()) == NULL) {
		dsLog("Can't get active crate.\n");
		return NULL;
	}

	if ((memory = allocateObject(crate, length)) == NULL) {
		dsLog("Can't allocate object.\n");
		return NULL;
	}

	memory += sizeof(dsObject);

	return memory;
}